

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCtrlSystem.cpp
# Opt level: O2

int __thiscall CCtrlSystem::isExist(CCtrlSystem *this,int *id)

{
  size_t i;
  long lVar1;
  
  lVar1 = 0;
  while( true ) {
    if (this->_size == lVar1) {
      return -1;
    }
    if (*id == this->_p_workerArray[lVar1]->_id) break;
    lVar1 = lVar1 + 1;
  }
  return (int)lVar1;
}

Assistant:

int CCtrlSystem::isExist(const int& id) const
{
	int index = -1; // ***************important*****************
	for (size_t i = 0; i < this->_size; i++)
	{
		if (id == this->_p_workerArray[i]->_id)
		{
			index = i;
			break;
		}
	}
	return index;
}